

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::FixStorageClass::ChangeResultType
          (FixStorageClass *this,Instruction *inst,uint32_t new_type_id)

{
  uint32_t uVar1;
  IRContext *pIVar2;
  uint32_t new_type_id_local;
  Instruction *inst_local;
  FixStorageClass *this_local;
  
  uVar1 = opt::Instruction::type_id(inst);
  if (uVar1 != new_type_id) {
    pIVar2 = Pass::context(&this->super_Pass);
    IRContext::ForgetUses(pIVar2,inst);
    opt::Instruction::SetResultType(inst,new_type_id);
    pIVar2 = Pass::context(&this->super_Pass);
    IRContext::AnalyzeUses(pIVar2,inst);
  }
  return uVar1 != new_type_id;
}

Assistant:

bool FixStorageClass::ChangeResultType(Instruction* inst,
                                       uint32_t new_type_id) {
  if (inst->type_id() == new_type_id) {
    return false;
  }

  context()->ForgetUses(inst);
  inst->SetResultType(new_type_id);
  context()->AnalyzeUses(inst);
  return true;
}